

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prog.cc
# Opt level: O1

void __thiscall
duckdb_re2::Prog::MarkSuccessors
          (Prog *this,SparseArray<int> *rootmap,SparseArray<int> *predmap,
          vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
          *predvec,SparseSet *reachable,vector<int,_std::allocator<int>_> *stk)

{
  pointer *ppvVar1;
  vector<int,std::allocator<int>> *this_00;
  int iVar2;
  int iVar3;
  Deleter DVar4;
  uint uVar5;
  IndexValue *pIVar6;
  int *piVar7;
  iterator iVar8;
  Inst *pIVar9;
  iterator __position;
  pointer pvVar10;
  _Head_base<1UL,_duckdb_re2::PODArray<duckdb_re2::SparseArray<int>::IndexValue>::Deleter,_false>
  _Var11;
  pointer piVar12;
  long lVar13;
  long lVar14;
  bool bVar15;
  bool bVar16;
  int id;
  _Head_base<1UL,_duckdb_re2::PODArray<int>::Deleter,_false> local_5c;
  anon_union_4_5_a14c903b_for_Inst_2 local_58;
  anon_union_4_5_a14c903b_for_Inst_2 local_54;
  Prog *local_50;
  SparseArray<int> *local_48;
  SparseSetT<void> *local_40;
  vector<int,_std::allocator<int>_> *local_38;
  
  pIVar6 = (rootmap->dense_).ptr_._M_t.
           super___uniq_ptr_impl<duckdb_re2::SparseArray<int>::IndexValue,_duckdb_re2::PODArray<duckdb_re2::SparseArray<int>::IndexValue>::Deleter>
           ._M_t.
           super__Tuple_impl<0UL,_duckdb_re2::SparseArray<int>::IndexValue_*,_duckdb_re2::PODArray<duckdb_re2::SparseArray<int>::IndexValue>::Deleter>
           .super__Head_base<0UL,_duckdb_re2::SparseArray<int>::IndexValue_*,_false>._M_head_impl;
  if ((pIVar6 != (IndexValue *)0x0) &&
     ((Deleter)*(int *)&(rootmap->dense_).ptr_._M_t.
                        super___uniq_ptr_impl<duckdb_re2::SparseArray<int>::IndexValue,_duckdb_re2::PODArray<duckdb_re2::SparseArray<int>::IndexValue>::Deleter>
                        ._M_t.
                        super__Tuple_impl<0UL,_duckdb_re2::SparseArray<int>::IndexValue_*,_duckdb_re2::PODArray<duckdb_re2::SparseArray<int>::IndexValue>::Deleter>
                        .
                        super__Tuple_impl<1UL,_duckdb_re2::PODArray<duckdb_re2::SparseArray<int>::IndexValue>::Deleter>
                        .
                        super__Head_base<1UL,_duckdb_re2::PODArray<duckdb_re2::SparseArray<int>::IndexValue>::Deleter,_false>
      != (Deleter)0x0)) {
    iVar2 = rootmap->size_;
    piVar7 = (rootmap->sparse_).ptr_._M_t.
             super___uniq_ptr_impl<int,_duckdb_re2::PODArray<int>::Deleter>._M_t.
             super__Tuple_impl<0UL,_int_*,_duckdb_re2::PODArray<int>::Deleter>.
             super__Head_base<0UL,_int_*,_false>._M_head_impl;
    *piVar7 = iVar2;
    iVar3 = rootmap->size_;
    pIVar6[iVar3].index_ = 0;
    rootmap->size_ = iVar3 + 1;
    pIVar6[*piVar7].value_ = iVar2;
  }
  bVar15 = pIVar6 != (IndexValue *)0x0;
  _Var11._M_head_impl.len_ = (Deleter)this->start_unanchored_;
  DVar4.len_ = *(int *)&(rootmap->dense_).ptr_._M_t.
                        super___uniq_ptr_impl<duckdb_re2::SparseArray<int>::IndexValue,_duckdb_re2::PODArray<duckdb_re2::SparseArray<int>::IndexValue>::Deleter>
                        ._M_t.
                        super__Tuple_impl<0UL,_duckdb_re2::SparseArray<int>::IndexValue_*,_duckdb_re2::PODArray<duckdb_re2::SparseArray<int>::IndexValue>::Deleter>
                        .
                        super__Tuple_impl<1UL,_duckdb_re2::PODArray<duckdb_re2::SparseArray<int>::IndexValue>::Deleter>
                        .
                        super__Head_base<1UL,_duckdb_re2::PODArray<duckdb_re2::SparseArray<int>::IndexValue>::Deleter,_false>
  ;
  if ((uint)_Var11._M_head_impl.len_ < (uint)DVar4.len_ && bVar15) {
    uVar5 = (rootmap->sparse_).ptr_._M_t.
            super___uniq_ptr_impl<int,_duckdb_re2::PODArray<int>::Deleter>._M_t.
            super__Tuple_impl<0UL,_int_*,_duckdb_re2::PODArray<int>::Deleter>.
            super__Head_base<0UL,_int_*,_false>._M_head_impl[(int)_Var11._M_head_impl.len_];
    if (uVar5 < (uint)rootmap->size_) {
      if ((Deleter)pIVar6[(int)uVar5].index_ != _Var11._M_head_impl.len_ &&
          ((uint)_Var11._M_head_impl.len_ < (uint)DVar4.len_ && bVar15)) {
LAB_004982e3:
        iVar2 = rootmap->size_;
        piVar7 = (rootmap->sparse_).ptr_._M_t.
                 super___uniq_ptr_impl<int,_duckdb_re2::PODArray<int>::Deleter>._M_t.
                 super__Tuple_impl<0UL,_int_*,_duckdb_re2::PODArray<int>::Deleter>.
                 super__Head_base<0UL,_int_*,_false>._M_head_impl;
        piVar7[(int)_Var11._M_head_impl.len_] = iVar2;
        iVar3 = rootmap->size_;
        pIVar6[iVar3].index_ = (int)_Var11._M_head_impl.len_;
        rootmap->size_ = iVar3 + 1;
        pIVar6[piVar7[(int)_Var11._M_head_impl.len_]].value_ = iVar2;
      }
    }
    else if ((uint)_Var11._M_head_impl.len_ < (uint)DVar4.len_ && bVar15) goto LAB_004982e3;
  }
  bVar15 = pIVar6 != (IndexValue *)0x0;
  _Var11._M_head_impl.len_ = (Deleter)this->start_;
  DVar4.len_ = *(int *)&(rootmap->dense_).ptr_._M_t.
                        super___uniq_ptr_impl<duckdb_re2::SparseArray<int>::IndexValue,_duckdb_re2::PODArray<duckdb_re2::SparseArray<int>::IndexValue>::Deleter>
                        ._M_t.
                        super__Tuple_impl<0UL,_duckdb_re2::SparseArray<int>::IndexValue_*,_duckdb_re2::PODArray<duckdb_re2::SparseArray<int>::IndexValue>::Deleter>
                        .
                        super__Tuple_impl<1UL,_duckdb_re2::PODArray<duckdb_re2::SparseArray<int>::IndexValue>::Deleter>
                        .
                        super__Head_base<1UL,_duckdb_re2::PODArray<duckdb_re2::SparseArray<int>::IndexValue>::Deleter,_false>
  ;
  if ((uint)_Var11._M_head_impl.len_ < (uint)DVar4.len_ && bVar15) {
    uVar5 = (rootmap->sparse_).ptr_._M_t.
            super___uniq_ptr_impl<int,_duckdb_re2::PODArray<int>::Deleter>._M_t.
            super__Tuple_impl<0UL,_int_*,_duckdb_re2::PODArray<int>::Deleter>.
            super__Head_base<0UL,_int_*,_false>._M_head_impl[(int)_Var11._M_head_impl.len_];
    if (uVar5 < (uint)rootmap->size_) {
      if ((Deleter)pIVar6[(int)uVar5].index_ == _Var11._M_head_impl.len_ ||
          ((uint)DVar4.len_ <= (uint)_Var11._M_head_impl.len_ || !bVar15)) goto LAB_0049835b;
    }
    else if ((uint)DVar4.len_ <= (uint)_Var11._M_head_impl.len_ || !bVar15) goto LAB_0049835b;
    iVar2 = rootmap->size_;
    piVar7 = (rootmap->sparse_).ptr_._M_t.
             super___uniq_ptr_impl<int,_duckdb_re2::PODArray<int>::Deleter>._M_t.
             super__Tuple_impl<0UL,_int_*,_duckdb_re2::PODArray<int>::Deleter>.
             super__Head_base<0UL,_int_*,_false>._M_head_impl;
    piVar7[(int)_Var11._M_head_impl.len_] = iVar2;
    iVar3 = rootmap->size_;
    pIVar6[iVar3].index_ = (int)_Var11._M_head_impl.len_;
    rootmap->size_ = iVar3 + 1;
    pIVar6[piVar7[(int)_Var11._M_head_impl.len_]].value_ = iVar2;
  }
LAB_0049835b:
  reachable->size_ = 0;
  piVar12 = (stk->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
            _M_start;
  if ((stk->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data._M_finish
      != piVar12) {
    (stk->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data._M_finish =
         piVar12;
  }
  local_58 = (anon_union_4_5_a14c903b_for_Inst_2)this->start_unanchored_;
  iVar8._M_current =
       (stk->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
       _M_finish;
  local_50 = this;
  local_48 = rootmap;
  if (iVar8._M_current ==
      (stk->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
      _M_end_of_storage) {
    std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>(stk,iVar8,&local_58.cap_);
  }
  else {
    *iVar8._M_current = (int)local_58;
    (stk->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data._M_finish =
         iVar8._M_current + 1;
  }
  piVar12 = (stk->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
            _M_finish;
  local_40 = reachable;
  local_38 = stk;
  if ((stk->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data._M_start
      != piVar12) {
    do {
      local_5c._M_head_impl.len_ = (Deleter)piVar12[-1];
      (stk->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data._M_finish
           = piVar12 + -1;
LAB_004983c9:
      while ((((piVar7 = (reachable->dense_).ptr_._M_t.
                         super___uniq_ptr_impl<int,_duckdb_re2::PODArray<int>::Deleter>._M_t.
                         super__Tuple_impl<0UL,_int_*,_duckdb_re2::PODArray<int>::Deleter>.
                         super__Head_base<0UL,_int_*,_false>._M_head_impl, piVar7 == (int *)0x0 ||
               ((uint)*(int *)&(reachable->dense_).ptr_._M_t.
                               super___uniq_ptr_impl<int,_duckdb_re2::PODArray<int>::Deleter>._M_t.
                               super__Tuple_impl<0UL,_int_*,_duckdb_re2::PODArray<int>::Deleter>.
                               super__Tuple_impl<1UL,_duckdb_re2::PODArray<int>::Deleter>.
                               super__Head_base<1UL,_duckdb_re2::PODArray<int>::Deleter,_false> <=
                (uint)local_5c._M_head_impl.len_)) ||
              (uVar5 = (reachable->sparse_).ptr_._M_t.
                       super___uniq_ptr_impl<int,_duckdb_re2::PODArray<int>::Deleter>._M_t.
                       super__Tuple_impl<0UL,_int_*,_duckdb_re2::PODArray<int>::Deleter>.
                       super__Head_base<0UL,_int_*,_false>._M_head_impl
                       [(int)local_5c._M_head_impl.len_], (uint)reachable->size_ <= uVar5)) ||
             ((Deleter)piVar7[(int)uVar5] != local_5c._M_head_impl.len_))) {
        SparseSetT<void>::InsertInternal(reachable,false,(int)local_5c._M_head_impl.len_);
        lVar13 = (long)(int)local_5c._M_head_impl.len_;
        pIVar9 = (local_50->inst_).ptr_._M_t.
                 super___uniq_ptr_impl<duckdb_re2::Prog::Inst,_duckdb_re2::PODArray<duckdb_re2::Prog::Inst>::Deleter>
                 ._M_t.
                 super__Tuple_impl<0UL,_duckdb_re2::Prog::Inst_*,_duckdb_re2::PODArray<duckdb_re2::Prog::Inst>::Deleter>
                 .super__Head_base<0UL,_duckdb_re2::Prog::Inst_*,_false>._M_head_impl;
        uVar5 = pIVar9[lVar13].out_opcode_;
        switch(uVar5 & 7) {
        case 0:
        case 1:
          local_58.out1_ = pIVar9[lVar13].out_opcode_ >> 4;
          local_54 = pIVar9[lVar13].field_1;
          lVar14 = 0;
          do {
            _Var11._M_head_impl.len_ = (Deleter)((Deleter *)((long)&local_58 + lVar14))->len_;
            pIVar6 = (predmap->dense_).ptr_._M_t.
                     super___uniq_ptr_impl<duckdb_re2::SparseArray<int>::IndexValue,_duckdb_re2::PODArray<duckdb_re2::SparseArray<int>::IndexValue>::Deleter>
                     ._M_t.
                     super__Tuple_impl<0UL,_duckdb_re2::SparseArray<int>::IndexValue_*,_duckdb_re2::PODArray<duckdb_re2::SparseArray<int>::IndexValue>::Deleter>
                     .super__Head_base<0UL,_duckdb_re2::SparseArray<int>::IndexValue_*,_false>.
                     _M_head_impl;
            bVar15 = (uint)*(int *)&(predmap->dense_).ptr_._M_t.
                                    super___uniq_ptr_impl<duckdb_re2::SparseArray<int>::IndexValue,_duckdb_re2::PODArray<duckdb_re2::SparseArray<int>::IndexValue>::Deleter>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_duckdb_re2::SparseArray<int>::IndexValue_*,_duckdb_re2::PODArray<duckdb_re2::SparseArray<int>::IndexValue>::Deleter>
                                    .
                                    super__Tuple_impl<1UL,_duckdb_re2::PODArray<duckdb_re2::SparseArray<int>::IndexValue>::Deleter>
                                    .
                                    super__Head_base<1UL,_duckdb_re2::PODArray<duckdb_re2::SparseArray<int>::IndexValue>::Deleter,_false>
                     <= (uint)_Var11._M_head_impl.len_;
            if (((bVar15 || pIVar6 == (IndexValue *)0x0) ||
                (uVar5 = (predmap->sparse_).ptr_._M_t.
                         super___uniq_ptr_impl<int,_duckdb_re2::PODArray<int>::Deleter>._M_t.
                         super__Tuple_impl<0UL,_int_*,_duckdb_re2::PODArray<int>::Deleter>.
                         super__Head_base<0UL,_int_*,_false>._M_head_impl
                         [(int)_Var11._M_head_impl.len_], (uint)predmap->size_ <= uVar5)) ||
               ((Deleter)pIVar6[(int)uVar5].index_ != _Var11._M_head_impl.len_)) {
              __position._M_current =
                   (predvec->
                   super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_finish;
              if (!bVar15 && pIVar6 != (IndexValue *)0x0) {
                pvVar10 = (predvec->
                          super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                          )._M_impl.super__Vector_impl_data._M_start;
                piVar7 = (predmap->sparse_).ptr_._M_t.
                         super___uniq_ptr_impl<int,_duckdb_re2::PODArray<int>::Deleter>._M_t.
                         super__Tuple_impl<0UL,_int_*,_duckdb_re2::PODArray<int>::Deleter>.
                         super__Head_base<0UL,_int_*,_false>._M_head_impl;
                piVar7[(int)_Var11._M_head_impl.len_] = predmap->size_;
                iVar2 = predmap->size_;
                pIVar6[iVar2].index_ = (int)_Var11._M_head_impl.len_;
                predmap->size_ = iVar2 + 1;
                pIVar6[piVar7[(int)_Var11._M_head_impl.len_]].value_ =
                     (int)((ulong)((long)__position._M_current - (long)pvVar10) >> 3) * -0x55555555;
              }
              if (__position._M_current ==
                  (predvec->
                  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_end_of_storage) {
                std::
                vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                ::_M_realloc_insert<>(predvec,__position);
              }
              else {
                ((__position._M_current)->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                super__Vector_impl_data._M_start = (pointer)0x0;
                ((__position._M_current)->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                super__Vector_impl_data._M_finish = (pointer)0x0;
                ((__position._M_current)->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                ppvVar1 = &(predvec->
                           super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                           )._M_impl.super__Vector_impl_data._M_finish;
                *ppvVar1 = *ppvVar1 + 1;
              }
            }
            this_00 = (vector<int,std::allocator<int>> *)
                      ((predvec->
                       super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_start +
                      (predmap->dense_).ptr_._M_t.
                      super___uniq_ptr_impl<duckdb_re2::SparseArray<int>::IndexValue,_duckdb_re2::PODArray<duckdb_re2::SparseArray<int>::IndexValue>::Deleter>
                      ._M_t.
                      super__Tuple_impl<0UL,_duckdb_re2::SparseArray<int>::IndexValue_*,_duckdb_re2::PODArray<duckdb_re2::SparseArray<int>::IndexValue>::Deleter>
                      .super__Head_base<0UL,_duckdb_re2::SparseArray<int>::IndexValue_*,_false>.
                      _M_head_impl
                      [(predmap->sparse_).ptr_._M_t.
                       super___uniq_ptr_impl<int,_duckdb_re2::PODArray<int>::Deleter>._M_t.
                       super__Tuple_impl<0UL,_int_*,_duckdb_re2::PODArray<int>::Deleter>.
                       super__Head_base<0UL,_int_*,_false>._M_head_impl
                       [(int)_Var11._M_head_impl.len_]].value_);
            iVar8._M_current = *(int **)(this_00 + 8);
            if (iVar8._M_current == *(int **)(this_00 + 0x10)) {
              std::vector<int,std::allocator<int>>::_M_realloc_insert<int&>
                        (this_00,iVar8,(int *)&local_5c);
            }
            else {
              *iVar8._M_current = (int)local_5c._M_head_impl.len_;
              *(int **)(this_00 + 8) = iVar8._M_current + 1;
            }
            stk = local_38;
            lVar14 = lVar14 + 4;
          } while (lVar14 != 8);
          local_58 = pIVar9[lVar13].field_1;
          iVar8._M_current =
               (local_38->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
               super__Vector_impl_data._M_finish;
          if (iVar8._M_current ==
              (local_38->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                      (local_38,iVar8,&local_58.cap_);
            reachable = local_40;
          }
          else {
            *iVar8._M_current = (int)local_58;
            (local_38->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
            super__Vector_impl_data._M_finish = iVar8._M_current + 1;
            reachable = local_40;
          }
          break;
        default:
          _Var11._M_head_impl.len_ = (Deleter)(uVar5 >> 4);
          pIVar6 = (local_48->dense_).ptr_._M_t.
                   super___uniq_ptr_impl<duckdb_re2::SparseArray<int>::IndexValue,_duckdb_re2::PODArray<duckdb_re2::SparseArray<int>::IndexValue>::Deleter>
                   ._M_t.
                   super__Tuple_impl<0UL,_duckdb_re2::SparseArray<int>::IndexValue_*,_duckdb_re2::PODArray<duckdb_re2::SparseArray<int>::IndexValue>::Deleter>
                   .super__Head_base<0UL,_duckdb_re2::SparseArray<int>::IndexValue_*,_false>.
                   _M_head_impl;
          bVar16 = pIVar6 != (IndexValue *)0x0;
          bVar15 = (uint)_Var11._M_head_impl.len_ <
                   (uint)*(int *)&(local_48->dense_).ptr_._M_t.
                                  super___uniq_ptr_impl<duckdb_re2::SparseArray<int>::IndexValue,_duckdb_re2::PODArray<duckdb_re2::SparseArray<int>::IndexValue>::Deleter>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_duckdb_re2::SparseArray<int>::IndexValue_*,_duckdb_re2::PODArray<duckdb_re2::SparseArray<int>::IndexValue>::Deleter>
                                  .
                                  super__Tuple_impl<1UL,_duckdb_re2::PODArray<duckdb_re2::SparseArray<int>::IndexValue>::Deleter>
                                  .
                                  super__Head_base<1UL,_duckdb_re2::PODArray<duckdb_re2::SparseArray<int>::IndexValue>::Deleter,_false>
          ;
          if (bVar15 && bVar16) {
            uVar5 = (local_48->sparse_).ptr_._M_t.
                    super___uniq_ptr_impl<int,_duckdb_re2::PODArray<int>::Deleter>._M_t.
                    super__Tuple_impl<0UL,_int_*,_duckdb_re2::PODArray<int>::Deleter>.
                    super__Head_base<0UL,_int_*,_false>._M_head_impl[(uint)_Var11._M_head_impl.len_]
            ;
            if (uVar5 < (uint)local_48->size_) {
              if ((bVar15 && bVar16) &&
                  (Deleter)pIVar6[(int)uVar5].index_ != _Var11._M_head_impl.len_) {
LAB_004985ba:
                iVar2 = local_48->size_;
                piVar7 = (local_48->sparse_).ptr_._M_t.
                         super___uniq_ptr_impl<int,_duckdb_re2::PODArray<int>::Deleter>._M_t.
                         super__Tuple_impl<0UL,_int_*,_duckdb_re2::PODArray<int>::Deleter>.
                         super__Head_base<0UL,_int_*,_false>._M_head_impl;
                piVar7[(uint)_Var11._M_head_impl.len_] = iVar2;
                iVar3 = local_48->size_;
                pIVar6[iVar3].index_ = (int)_Var11._M_head_impl.len_;
                local_48->size_ = iVar3 + 1;
                pIVar6[piVar7[(uint)_Var11._M_head_impl.len_]].value_ = iVar2;
              }
            }
            else if (bVar15 && bVar16) goto LAB_004985ba;
          }
          break;
        case 5:
        case 7:
          goto switchD_00498424_caseD_5;
        case 6:
          goto switchD_00498424_caseD_6;
        }
        local_5c._M_head_impl.len_ = (Deleter)(pIVar9[lVar13].out_opcode_ >> 4);
      }
switchD_00498424_caseD_5:
      piVar12 = (stk->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data
                ._M_finish;
    } while ((stk->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
             _M_start != piVar12);
  }
  return;
switchD_00498424_caseD_6:
  local_5c._M_head_impl.len_ = (Deleter)(uVar5 >> 4);
  goto LAB_004983c9;
}

Assistant:

void Prog::MarkSuccessors(SparseArray<int>* rootmap,
                          SparseArray<int>* predmap,
                          std::vector<std::vector<int>>* predvec,
                          SparseSet* reachable, std::vector<int>* stk) {
  // Mark the kInstFail instruction.
  rootmap->set_new(0, rootmap->size());

  // Mark the start_unanchored and start instructions.
  if (!rootmap->has_index(start_unanchored()))
    rootmap->set_new(start_unanchored(), rootmap->size());
  if (!rootmap->has_index(start()))
    rootmap->set_new(start(), rootmap->size());

  reachable->clear();
  stk->clear();
  stk->push_back(start_unanchored());
  while (!stk->empty()) {
    int id = stk->back();
    stk->pop_back();
  Loop:
    if (reachable->contains(id))
      continue;
    reachable->insert_new(id);

    Inst* ip = inst(id);
    switch (ip->opcode()) {
      default:
        LOG(DFATAL) << "unhandled opcode: " << ip->opcode();
        break;

      case kInstAltMatch:
      case kInstAlt:
        // Mark this instruction as a predecessor of each out.
        for (int out : {ip->out(), ip->out1()}) {
          if (!predmap->has_index(out)) {
            predmap->set_new(out, static_cast<int>(predvec->size()));
            predvec->emplace_back();
          }
          (*predvec)[predmap->get_existing(out)].emplace_back(id);
        }
        stk->push_back(ip->out1());
        id = ip->out();
        goto Loop;

      case kInstByteRange:
      case kInstCapture:
      case kInstEmptyWidth:
        // Mark the out of this instruction as a "root".
        if (!rootmap->has_index(ip->out()))
          rootmap->set_new(ip->out(), rootmap->size());
        id = ip->out();
        goto Loop;

      case kInstNop:
        id = ip->out();
        goto Loop;

      case kInstMatch:
      case kInstFail:
        break;
    }
  }
}